

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::Mutex::AwaitCommon(Mutex *this,Condition *cond,KernelTimeout t)

{
  bool bVar1;
  undefined1 *how_arg;
  PerThreadSynch *thread_arg;
  bool local_b1;
  int local_84;
  bool res;
  int flags;
  undefined1 local_78 [8];
  SynchWaitParams waitp;
  MuHow how;
  Condition *cond_local;
  Mutex *this_local;
  KernelTimeout t_local;
  memory_order __b;
  
  AssertReaderHeld(this);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  how_arg = kSharedS;
  if (((this->mu_).super___atomic_base<long>._M_i & 8U) != 0) {
    how_arg = kExclusiveS;
  }
  waitp.contention_start_cycles = (int64_t)how_arg;
  thread_arg = Synch_GetPerThreadAnnotated(this);
  SynchWaitParams::SynchWaitParams
            ((SynchWaitParams *)local_78,(MuHow)how_arg,cond,t,(Mutex *)0x0,thread_arg,
             (atomic<long> *)0x0);
  local_84 = 1;
  bVar1 = Condition::GuaranteedEqual(cond,(Condition *)0x0);
  if (!bVar1) {
    local_84 = 3;
  }
  UnlockSlow(this,(SynchWaitParams *)local_78);
  Block(this,(PerThreadSynch *)waitp.cvmu);
  LockSlowLoop(this,(SynchWaitParams *)local_78,local_84);
  local_b1 = true;
  if (waitp.how == (MuHow)0x0) {
    local_b1 = EvalConditionAnnotated
                         (cond,this,true,false,
                          (undefined1 *)waitp.contention_start_cycles == kSharedS);
  }
  return local_b1;
}

Assistant:

bool Mutex::AwaitCommon(const Condition &cond, KernelTimeout t) {
  this->AssertReaderHeld();
  MuHow how =
      (mu_.load(std::memory_order_relaxed) & kMuWriter) ? kExclusive : kShared;
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, TsanFlags(how));
  SynchWaitParams waitp(
      how, &cond, t, nullptr /*no cvmu*/, Synch_GetPerThreadAnnotated(this),
      nullptr /*no cv_word*/);
  int flags = kMuHasBlocked;
  if (!Condition::GuaranteedEqual(&cond, nullptr)) {
    flags |= kMuIsCond;
  }
  this->UnlockSlow(&waitp);
  this->Block(waitp.thread);
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, TsanFlags(how));
  ABSL_TSAN_MUTEX_PRE_LOCK(this, TsanFlags(how));
  this->LockSlowLoop(&waitp, flags);
  bool res = waitp.cond != nullptr ||  // => cond known true from LockSlowLoop
             EvalConditionAnnotated(&cond, this, true, false, how == kShared);
  ABSL_TSAN_MUTEX_POST_LOCK(this, TsanFlags(how), 0);
  return res;
}